

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

void __thiscall TaprootBuilder::Insert(TaprootBuilder *this,NodeInfo *node,int depth)

{
  long lVar1;
  bool bVar2;
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  *this_00;
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  *pvVar3;
  size_type sVar4;
  uint in_EDX;
  NodeInfo *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  NodeInfo *in_stack_ffffffffffffff78;
  NodeInfo *in_stack_ffffffffffffff80;
  NodeInfo *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  bool local_55;
  uint local_54;
  NodeInfo *in_stack_ffffffffffffffc8;
  NodeInfo *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_55 = 0x80 < in_EDX;
  if (local_55) {
    __assert_fail("depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x13f,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
  }
  this_00 = (vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             *)((long)(int)in_EDX + 1);
  pvVar3 = (vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
            *)std::
              vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
              ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      *)in_stack_ffffffffffffff78);
  local_54 = in_EDX;
  if (this_00 < pvVar3) {
    *in_RDI = 0;
  }
  else {
    while( true ) {
      uVar5 = false;
      if ((*in_RDI & 1) != 0) {
        sVar4 = std::
                vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                        *)in_stack_ffffffffffffff78);
        uVar5 = false;
        if ((ulong)(long)(int)local_54 < sVar4) {
          std::
          vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
          ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                        *)in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
          uVar5 = std::optional<TaprootBuilder::NodeInfo>::has_value
                            ((optional<TaprootBuilder::NodeInfo> *)in_stack_ffffffffffffff78);
        }
      }
      if ((bool)uVar5 == false) break;
      in_stack_ffffffffffffff88 = in_RSI;
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    *)in_RSI,(size_type)in_stack_ffffffffffffff80);
      std::optional<TaprootBuilder::NodeInfo>::operator*
                ((optional<TaprootBuilder::NodeInfo> *)in_stack_ffffffffffffff78);
      Combine(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      NodeInfo::operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      NodeInfo::~NodeInfo(in_stack_ffffffffffffff78);
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::pop_back((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  *)in_stack_ffffffffffffff78);
      if (local_54 == 0) {
        *in_RDI = 0;
      }
      local_54 = local_54 - 1;
    }
    if ((*in_RDI & 1) != 0) {
      sVar4 = std::
              vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
              ::size((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                      *)in_stack_ffffffffffffff78);
      if (sVar4 <= (ulong)(long)(int)local_54) {
        std::
        vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ::resize(this_00,CONCAT17(uVar5,in_stack_ffffffffffffff90));
      }
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    *)in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
      bVar2 = std::optional<TaprootBuilder::NodeInfo>::has_value
                        ((optional<TaprootBuilder::NodeInfo> *)in_stack_ffffffffffffff78);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!m_branch[depth].has_value()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                      ,0x152,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
      }
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::operator[]((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    *)in_stack_ffffffffffffff88,(size_type)in_RSI);
      std::optional<TaprootBuilder::NodeInfo>::operator=
                ((optional<TaprootBuilder::NodeInfo> *)in_stack_ffffffffffffff88,in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TaprootBuilder::Insert(TaprootBuilder::NodeInfo&& node, int depth)
{
    assert(depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT);
    /* We cannot insert a leaf at a lower depth while a deeper branch is unfinished. Doing
     * so would mean the Add() invocations do not correspond to a DFS traversal of a
     * binary tree. */
    if ((size_t)depth + 1 < m_branch.size()) {
        m_valid = false;
        return;
    }
    /* As long as an entry in the branch exists at the specified depth, combine it and propagate up.
     * The 'node' variable is overwritten here with the newly combined node. */
    while (m_valid && m_branch.size() > (size_t)depth && m_branch[depth].has_value()) {
        node = Combine(std::move(node), std::move(*m_branch[depth]));
        m_branch.pop_back();
        if (depth == 0) m_valid = false; /* Can't propagate further up than the root */
        --depth;
    }
    if (m_valid) {
        /* Make sure the branch is big enough to place the new node. */
        if (m_branch.size() <= (size_t)depth) m_branch.resize((size_t)depth + 1);
        assert(!m_branch[depth].has_value());
        m_branch[depth] = std::move(node);
    }
}